

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int lua_dump(lua_State *L,lua_Writer writer,void *data)

{
  long in_RDI;
  cTValue *o;
  void *in_stack_00000020;
  lua_Writer in_stack_00000028;
  GCproto *in_stack_00000030;
  lua_State *in_stack_00000038;
  undefined4 local_4;
  
  if ((*(int *)(*(long *)(in_RDI + 0x18) + -4) == -9) &&
     (*(char *)((ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8) + 6) == '\0')) {
    local_4 = lj_bcwrite(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                         L._4_4_);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

LUA_API int lua_dump(lua_State *L, lua_Writer writer, void *data)
{
  cTValue *o = L->top-1;
  api_check(L, L->top > L->base);
  if (tvisfunc(o) && isluafunc(funcV(o)))
    return lj_bcwrite(L, funcproto(funcV(o)), writer, data, 0);
  else
    return 1;
}